

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__decode_half_float_linear(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  void *input;
  float *pfVar2;
  float fVar3;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    while (decodep + 4 <= pfVar1) {
      fVar3 = stbir__half_to_float(*inputp);
      *decodep = fVar3;
      fVar3 = stbir__half_to_float(*(stbir__FP16 *)((long)inputp + 2));
      decodep[1] = fVar3;
      fVar3 = stbir__half_to_float(*(stbir__FP16 *)((long)inputp + 4));
      decodep[2] = fVar3;
      fVar3 = stbir__half_to_float(*(stbir__FP16 *)((long)inputp + 6));
      decodep[3] = fVar3;
      inputp = (void *)((long)inputp + 8);
      decodep = decodep + 4;
    }
    for (; decodep < pfVar1; decodep = decodep + 1) {
      fVar3 = stbir__half_to_float(*inputp);
      *decodep = fVar3;
      inputp = (void *)((long)inputp + 2);
    }
  }
  else {
    input = inputp;
    do {
      do {
        stbir__half_to_float_SIMD(decodep,input);
        pfVar2 = decodep + 8;
        input = (void *)((long)input + 0x10);
        decodep = pfVar2;
      } while (pfVar2 <= pfVar1 + -8);
      input = (void *)((long)inputp + (long)width_times_channels * 2 + -0x10);
      decodep = pfVar1 + -8;
    } while (pfVar2 != pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_half_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  stbir__FP16 const * input = (stbir__FP16 const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    stbir__FP16 const * end_input_m8 = input + width_times_channels - 8;
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);

      stbir__half_to_float_SIMD( decode, input );
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, decode );
        stbir__decode_simdf8_flip( of );
        stbir__simdf8_store( decode, of );
      }
      #else
      {
        stbir__simdf of0,of1;
        stbir__simdf_load( of0, decode );
        stbir__simdf_load( of1, decode+4 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
      }
      #endif
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = stbir__half_to_float(input[stbir__decode_order0]);
    decode[1-4] = stbir__half_to_float(input[stbir__decode_order1]);
    decode[2-4] = stbir__half_to_float(input[stbir__decode_order2]);
    decode[3-4] = stbir__half_to_float(input[stbir__decode_order3]);
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__half_to_float(input[stbir__decode_order0]);
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__half_to_float(input[stbir__decode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__half_to_float(input[stbir__decode_order2]);
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}